

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteType(WatWriter *this,Type type,NextChar next_char)

{
  char *s;
  string local_40;
  NextChar local_1c;
  WatWriter *pWStack_18;
  NextChar next_char_local;
  WatWriter *this_local;
  Type type_local;
  
  local_1c = next_char;
  pWStack_18 = this;
  this_local = (WatWriter *)type;
  Type::GetName_abi_cxx11_(&local_40,(Type *)&this_local);
  s = (char *)std::__cxx11::string::c_str();
  WritePuts(this,s,local_1c);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void WatWriter::WriteType(Type type, NextChar next_char) {
  WritePuts(type.GetName().c_str(), next_char);
}